

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

bool __thiscall wabt::WastParser::ParseOffsetExprOpt(WastParser *this,ExprList *out_expr_list)

{
  bool bVar1;
  Result RVar2;
  
  bVar1 = MatchLpar(this,Offset);
  if (bVar1) {
    RVar2 = ParseTerminatingInstrList(this,out_expr_list);
    bVar1 = true;
    if (RVar2.enum_ != Error) {
      Expect(this,Rpar);
    }
  }
  else {
    bVar1 = PeekMatchExpr(this);
    if (bVar1) {
      ParseExpr(this,out_expr_list);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool WastParser::ParseOffsetExprOpt(ExprList* out_expr_list) {
  WABT_TRACE(ParseOffsetExprOpt);
  if (MatchLpar(TokenType::Offset)) {
    CHECK_RESULT(ParseTerminatingInstrList(out_expr_list));
    EXPECT(Rpar);
    return true;
  } else if (PeekMatchExpr()) {
    CHECK_RESULT(ParseExpr(out_expr_list));
    return true;
  } else {
    return false;
  }
}